

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strip.cpp
# Opt level: O0

void __thiscall wasm::Strip::Strip(Strip *this,Decider *decider)

{
  Decider *decider_local;
  Strip *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Strip_0309f700;
  std::function<bool_(wasm::CustomSection_&)>::function(&this->decider,decider);
  return;
}

Assistant:

Strip(Decider decider) : decider(decider) {}